

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

int __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::cmp
          (iterator *this,void *param_1,void *param_2)

{
  bool bVar1;
  node_type nVar2;
  int iVar3;
  const_reference this_00;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  key_view a;
  key_view b;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  node_ptr *node;
  art_key_type *akey_local;
  iterator *this_local;
  
  bVar1 = std::
          stack<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
          ::empty(&this->stack_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa72,
                  "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  this_00 = std::
            stack<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
            ::top(&this->stack_);
  nVar2 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)this_00);
  if (nVar2 == LEAF) {
    this_01 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
              ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                        ((basic_node_ptr<unodb::detail::olc_node_header> *)this_00);
    a = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::get_key_view(this_01);
    b = detail::basic_art_key<unsigned_long>::get_key_view((basic_art_key<unsigned_long> *)param_1);
    iVar3 = detail::compare(a,b);
    return iVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa74,
                "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

int olc_db<Key, Value>::iterator::cmp(const art_key_type& akey) const noexcept {
  // TODO(thompsonbry) : variable length keys. Explore a cheaper way
  // to handle the exclusive bound case when developing variable
  // length key support based on the maintained key buffer.
  UNODB_DETAIL_ASSERT(!stack_.empty());
  auto& node = stack_.top().node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);
  const auto* const leaf{node.template ptr<leaf_type*>()};
  return unodb::detail::compare(leaf->get_key_view(), akey.get_key_view());
}